

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitwise.cpp
# Opt level: O2

short duckdb::BitwiseShiftLeftOperator::Operation<short,short,short>(short input,short shift)

{
  OutOfRangeException *pOVar1;
  allocator local_d9;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  if (input < 0) {
    pOVar1 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_d8,"Cannot left-shift negative number %s",&local_d9);
    NumericHelper::ToString<short>(&local_38,input);
    OutOfRangeException::OutOfRangeException<std::__cxx11::string>(pOVar1,&local_d8,&local_38);
    __cxa_throw(pOVar1,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if (-1 < shift) {
    if ((ushort)shift < 0x10) {
      if (shift != 0) {
        if ((ushort)(0x8000 >> ((byte)shift & 0x1f)) <= (ushort)input) {
          pOVar1 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&local_d8,"Overflow in left shift (%s << %s)",&local_d9);
          NumericHelper::ToString<short>(&local_98,input);
          NumericHelper::ToString<short>(&local_b8,shift);
          OutOfRangeException::OutOfRangeException<std::__cxx11::string,std::__cxx11::string>
                    (pOVar1,&local_d8,&local_98,&local_b8);
          __cxa_throw(pOVar1,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
        }
        input = input << ((byte)shift & 0x1f);
      }
    }
    else {
      if (input != 0) {
        pOVar1 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_d8,"Left-shift value %s is out of range",&local_d9);
        NumericHelper::ToString<short>(&local_78,shift);
        OutOfRangeException::OutOfRangeException<std::__cxx11::string>(pOVar1,&local_d8,&local_78);
        __cxa_throw(pOVar1,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
      input = 0;
    }
    return input;
  }
  pOVar1 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_d8,"Cannot left-shift by negative number %s",&local_d9);
  NumericHelper::ToString<short>(&local_58,shift);
  OutOfRangeException::OutOfRangeException<std::__cxx11::string>(pOVar1,&local_d8,&local_58);
  __cxa_throw(pOVar1,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static inline TR Operation(TA input, TB shift) {
		TA max_shift = TA(sizeof(TA) * 8) + (NumericLimits<TA>::IsSigned() ? 0 : 1);
		if (input < 0) {
			throw OutOfRangeException("Cannot left-shift negative number %s", NumericHelper::ToString(input));
		}
		if (shift < 0) {
			throw OutOfRangeException("Cannot left-shift by negative number %s", NumericHelper::ToString(shift));
		}
		if (shift >= max_shift) {
			if (input == 0) {
				return 0;
			}
			throw OutOfRangeException("Left-shift value %s is out of range", NumericHelper::ToString(shift));
		}
		if (shift == 0) {
			return input;
		}
		TA max_value = UnsafeNumericCast<TA>((TA(1) << (max_shift - shift - 1)));
		if (input >= max_value) {
			throw OutOfRangeException("Overflow in left shift (%s << %s)", NumericHelper::ToString(input),
			                          NumericHelper::ToString(shift));
		}
		return UnsafeNumericCast<TR>(input << shift);
	}